

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_TestParamSet_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  bool bVar2;
  fe_t_conflict acc;
  fe_t_conflict t15;
  
  fiat_id_GostR3410_2001_TestParamSet_square(acc,t1);
  fiat_id_GostR3410_2001_TestParamSet_mul(t15,t1,acc);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_TestParamSet_mul(t15,t15,acc);
  }
  fiat_id_GostR3410_2001_TestParamSet_square(acc,t1);
  iVar1 = 0xf4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_TestParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_TestParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_TestParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_TestParamSet_mul(output,acc,t15);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_inv(fe_t output,
                                                    const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t15;

    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_TestParamSet_mul(t15, t1, acc);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_TestParamSet_mul(t15, t15, acc);
    fiat_id_GostR3410_2001_TestParamSet_square(acc, t1);
    for (i = 0; i < 244; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_TestParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_TestParamSet_mul(output, acc, t15);
}